

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall xemmai::t_emit::f_at(t_emit *this,t_node *a_node)

{
  t_code *ptVar1;
  t_at_address local_28;
  
  ptVar1 = this->v_code;
  local_28.super_t_at.v_column = (a_node->v_at).v_column;
  local_28.super_t_at.v_position = (a_node->v_at).v_position;
  local_28.super_t_at.v_line = (a_node->v_at).v_line;
  local_28.v_address =
       (long)(ptVar1->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar1->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::
  emplace_back<xemmai::t_code::t_at_address>(&ptVar1->v_ats,&local_28);
  return;
}

Assistant:

void f_at(ast::t_node* a_node)
	{
		v_code->v_ats.push_back({a_node->v_at, f_last()});
	}